

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

Token * __thiscall Lexer::match_semicolon(Token *__return_storage_ptr__,Lexer *this)

{
  int iVar1;
  int iVar2;
  
  advance(this);
  skip_whitespace(this);
  iVar1 = (this->position_).super_Position.row_;
  iVar2 = (this->position_).super_Position.col_;
  __return_storage_ptr__->type_ = kSemicolon;
  (__return_storage_ptr__->content_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->content_).field_2;
  (__return_storage_ptr__->content_)._M_string_length = 0;
  (__return_storage_ptr__->content_).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->position_).super_Position.row_ = iVar1;
  (__return_storage_ptr__->position_).super_Position.col_ = iVar2;
  (__return_storage_ptr__->position_).super_Position._vptr_Position =
       (_func_int **)&PTR_clear_00153a10;
  (__return_storage_ptr__->position_).length_ = 1;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::match_semicolon() {
    consume();
    return Token(Token::Type::kSemicolon, TokenPosition(position_, 1));
}